

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::(anonymous_namespace)::SymbolProperties::GetBinary_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  bool bVar1;
  ssize_t sVar2;
  ssize_t ll;
  char buf [1024];
  string binary;
  SymbolProperties *this_local;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                          "/proc/self/exe");
  if (bVar1) {
    std::__cxx11::string::string((string *)(buf + 0x3f8));
    memset(&ll,0,0x400);
    sVar2 = readlink("/proc/self/exe",(char *)&ll,0x400);
    if (sVar2 < 1) {
      std::__cxx11::string::operator=((string *)(buf + 0x3f8),"/proc/self/exe");
    }
    else {
      buf[sVar2 + -8] = '\0';
      std::__cxx11::string::operator=((string *)(buf + 0x3f8),(char *)&ll);
    }
    anon_unknown_3::SymbolProperties::GetFileName
              (__return_storage_ptr__,(SymbolProperties *)this,(string *)(buf + 0x3f8));
    std::__cxx11::string::~string((string *)(buf + 0x3f8));
  }
  else {
    anon_unknown_3::SymbolProperties::GetFileName
              (__return_storage_ptr__,(SymbolProperties *)this,(string *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SymbolProperties::GetBinary() const
{
// only linux has proc fs
#if defined(__linux__)
  if (this->Binary == "/proc/self/exe") {
    std::string binary;
    char buf[1024] = { '\0' };
    ssize_t ll = 0;
    if ((ll = readlink("/proc/self/exe", buf, 1024)) > 0) {
      buf[ll] = '\0';
      binary = buf;
    } else {
      binary = "/proc/self/exe";
    }
    return this->GetFileName(binary);
  }
#endif
  return this->GetFileName(this->Binary);
}